

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_Gt_Test::Body(iu_MatcherFailure_x_iutest_x_Gt_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  int local_2a4;
  string local_2a0;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_220;
  iuCodeMessage local_200;
  AssertionResult iutest_ar;
  undefined1 local_1a8 [392];
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1a8._8_8_ = &local_200;
  local_200.m_message._M_dataplus._M_p._0_4_ = 1;
  local_1a8._0_8_ = &PTR__IMatcher_00224480;
  local_2a0._M_dataplus._M_p._0_4_ = 0;
  iutest::detail::GtMatcher<int>::operator()
            (&iutest_ar,(GtMatcher<int> *)local_1a8,(int *)&local_2a0);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_2a4 = 0;
    iutest::PrintToString<int>(&local_220,&local_2a4);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(detail *)local_220._M_dataplus._M_p,"Gt(1)",(char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1cb,(char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                       local_2a0._M_dataplus._M_p._0_4_));
    local_200._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_220);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"Gt: 1",(allocator<char> *)&local_200);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1cb,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_2a0._M_dataplus._M_p._0_4_ = 1;
  local_1a8._0_8_ = &PTR__IMatcher_00224480;
  local_200.m_message._M_dataplus._M_p._0_4_ = local_2a0._M_dataplus._M_p._0_4_;
  local_1a8._8_8_ = &local_200;
  iutest::detail::GtMatcher<int>::operator()
            (&iutest_ar,(GtMatcher<int> *)local_1a8,(int *)&local_2a0);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_2a4 = 1;
    iutest::PrintToString<int>(&local_220,&local_2a4);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(detail *)local_220._M_dataplus._M_p,"Gt(1)",(char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1cc,(char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                       local_2a0._M_dataplus._M_p._0_4_));
    local_200._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_220);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"Gt: 1",(allocator<char> *)&local_200);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1cc,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, Gt)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0, Gt(1)), "Gt: 1" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(1, Gt(1)), "Gt: 1" );
}